

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O3

Parameters * __thiscall cnn::Model::add_parameters(Model *this,Dim *d,float scale)

{
  iterator __position;
  iterator __position_00;
  Parameters *this_00;
  Parameters *p;
  Parameters *local_28;
  Parameters *local_20;
  
  this_00 = (Parameters *)operator_new(0xc0);
  Parameters::Parameters(this_00,d,scale);
  __position._M_current = *(ParametersBase ***)(this + 8);
  local_20 = this_00;
  local_28 = this_00;
  if (__position._M_current == *(ParametersBase ***)(this + 0x10)) {
    std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
    _M_realloc_insert<cnn::ParametersBase*>
              ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,__position,
               (ParametersBase **)&local_28);
  }
  else {
    *__position._M_current = (ParametersBase *)this_00;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  __position_00._M_current = *(Parameters ***)(this + 0x20);
  if (__position_00._M_current == *(Parameters ***)(this + 0x28)) {
    std::vector<cnn::Parameters*,std::allocator<cnn::Parameters*>>::
    _M_realloc_insert<cnn::Parameters*const&>
              ((vector<cnn::Parameters*,std::allocator<cnn::Parameters*>> *)(this + 0x18),
               __position_00,&local_20);
  }
  else {
    *__position_00._M_current = this_00;
    *(long *)(this + 0x20) = *(long *)(this + 0x20) + 8;
    local_20 = this_00;
  }
  return local_20;
}

Assistant:

Parameters* Model::add_parameters(const Dim& d, float scale) {
  Parameters* p = new Parameters(d, scale);
  all_params.push_back(p);
  params.push_back(p);
  return p;
}